

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O0

void * __thiscall asmjit::_abi_1_10::Zone::_alloc(Zone *this,size_t size,size_t alignment)

{
  uint8_t *puVar1;
  uchar *puVar2;
  unsigned_long uVar3;
  Block *this_00;
  uchar *puVar4;
  unsigned_long in_RDX;
  ulong in_RSI;
  Zone *in_RDI;
  uint8_t *end_1;
  uint8_t *ptr_1;
  Block *newBlock;
  size_t newSize;
  size_t blockAlignmentOverhead;
  uint8_t *end;
  uint8_t *ptr;
  size_t minimumAlignment;
  size_t rawBlockAlignment;
  Block *next;
  Block *curBlock;
  char *in_stack_00000360;
  int in_stack_0000036c;
  char *in_stack_00000370;
  size_t local_70;
  size_t local_68;
  unsigned_long local_60;
  long local_58;
  uchar *local_50;
  uchar *local_48;
  unsigned_long local_40;
  size_t local_38;
  Block *local_30;
  Block *local_28;
  unsigned_long local_20;
  ulong local_18 [2];
  uchar *local_8;
  
  local_28 = in_RDI->_block;
  local_30 = local_28->next;
  local_20 = in_RDX;
  local_18[0] = in_RSI;
  local_38 = blockAlignment(in_RDI);
  local_40 = Support::max<unsigned_long>(&local_20,&local_38);
  if (local_30 != (Block *)0x0) {
    puVar1 = Block::data(local_30);
    local_48 = Support::alignUp<unsigned_char*,unsigned_long>(puVar1,local_40);
    puVar1 = Block::data(local_30);
    local_50 = Support::alignDown<unsigned_char*,unsigned_long>(puVar1 + local_30->size,local_38);
    if (local_18[0] <= (ulong)((long)local_50 - (long)local_48)) {
      in_RDI->_block = local_30;
      in_RDI->_ptr = local_48 + local_18[0];
      puVar1 = Block::data(local_30);
      puVar2 = Support::alignDown<unsigned_char*,unsigned_long>(puVar1 + local_30->size,local_38);
      in_RDI->_end = puVar2;
      return local_48;
    }
  }
  local_60 = 8;
  uVar3 = Support::min<unsigned_long>(&local_20,&local_60);
  local_58 = local_20 - uVar3;
  local_70 = blockSize(in_RDI);
  uVar3 = Support::max<unsigned_long>(&local_70,local_18);
  if (-local_58 - 0x19U < uVar3) {
    local_8 = (uchar *)0x0;
  }
  else {
    local_68 = local_58 + uVar3;
    this_00 = (Block *)malloc(local_68 + 0x18);
    if (this_00 == (Block *)0x0) {
      local_8 = (uchar *)0x0;
    }
    else {
      this_00->prev = (Block *)0x0;
      this_00->next = (Block *)0x0;
      this_00->size = local_68;
      if (local_28 != (Block *)_zeroBlock) {
        this_00->prev = local_28;
        local_28->next = this_00;
        if (local_30 != (Block *)0x0) {
          this_00->next = local_30;
          local_30->prev = this_00;
        }
      }
      puVar1 = Block::data(this_00);
      puVar2 = Support::alignUp<unsigned_char*,unsigned_long>(puVar1,local_40);
      puVar1 = Block::data(this_00);
      puVar4 = Support::alignDown<unsigned_char*,unsigned_long>(puVar1 + local_68,local_38);
      in_RDI->_ptr = puVar2 + local_18[0];
      in_RDI->_end = puVar4;
      in_RDI->_block = this_00;
      local_8 = puVar2;
      if (in_RDI->_end < in_RDI->_ptr) {
        DebugUtils::assertionFailed(in_stack_00000370,in_stack_0000036c,in_stack_00000360);
      }
    }
  }
  return local_8;
}

Assistant:

void* Zone::_alloc(size_t size, size_t alignment) noexcept {
  Block* curBlock = _block;
  Block* next = curBlock->next;

  size_t rawBlockAlignment = blockAlignment();
  size_t minimumAlignment = Support::max<size_t>(alignment, rawBlockAlignment);

  // If the `Zone` has been cleared the current block doesn't have to be the last one. Check if there is a block
  // that can be used instead of allocating a new one. If there is a `next` block it's completely unused, we don't
  // have to check for remaining bytes in that case.
  if (next) {
    uint8_t* ptr = Support::alignUp(next->data(), minimumAlignment);
    uint8_t* end = Support::alignDown(next->data() + next->size, rawBlockAlignment);

    if (size <= (size_t)(end - ptr)) {
      _block = next;
      _ptr = ptr + size;
      _end = Support::alignDown(next->data() + next->size, rawBlockAlignment);
      return static_cast<void*>(ptr);
    }
  }

  size_t blockAlignmentOverhead = alignment - Support::min<size_t>(alignment, Globals::kAllocAlignment);
  size_t newSize = Support::max(blockSize(), size);

  // Prevent arithmetic overflow.
  if (ASMJIT_UNLIKELY(newSize > SIZE_MAX - kBlockSize - blockAlignmentOverhead))
    return nullptr;

  // Allocate new block - we add alignment overhead to `newSize`, which becomes the new block size, and we also add
  // `kBlockOverhead` to the allocator as it includes members of `Zone::Block` structure.
  newSize += blockAlignmentOverhead;
  Block* newBlock = static_cast<Block*>(::malloc(newSize + kBlockSize));

  if (ASMJIT_UNLIKELY(!newBlock))
    return nullptr;

  // Align the pointer to `minimumAlignment` and adjust the size of this block accordingly. It's the same as using
  // `minimumAlignment - Support::alignUpDiff()`, just written differently.
  {
    newBlock->prev = nullptr;
    newBlock->next = nullptr;
    newBlock->size = newSize;

    if (curBlock != &_zeroBlock) {
      newBlock->prev = curBlock;
      curBlock->next = newBlock;

      // Does only happen if there is a next block, but the requested memory can't fit into it. In this case a new
      // buffer is allocated and inserted between the current block and the next one.
      if (next) {
        newBlock->next = next;
        next->prev = newBlock;
      }
    }

    uint8_t* ptr = Support::alignUp(newBlock->data(), minimumAlignment);
    uint8_t* end = Support::alignDown(newBlock->data() + newSize, rawBlockAlignment);

    _ptr = ptr + size;
    _end = end;
    _block = newBlock;

    ASMJIT_ASSERT(_ptr <= _end);
    return static_cast<void*>(ptr);
  }
}